

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

uint32_t Keyset::xorShift(uint32_t x,uint32_t y)

{
  uint uVar1;
  bool hasUpperBit;
  uint i;
  unsigned_long count;
  uint32_t result;
  uint32_t y_local;
  uint32_t x_local;
  
  result = x;
  for (i = 0; i < 0x20; i = i + 1) {
    uVar1 = result & 0x80000000;
    result = result << 1;
    if (uVar1 != 0) {
      result = y ^ result;
    }
  }
  return result;
}

Assistant:

static uint32_t xorShift(uint32_t x, uint32_t y)
	{
		auto result = x;
		const auto count = sizeof(x) * CHAR_BIT;
		for (auto i = 0u; i < count; ++i) {
			const auto hasUpperBit = (result & UINT32_C(0x80000000)) != 0;
			result <<= 1;
			if (hasUpperBit) {
				result ^= y;
			}
		}
		return result;
	}